

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O3

bool __thiscall
LowererMDArch::EmitLoadInt32
          (LowererMDArch *this,Instr *instrLoad,bool conversionFromObjectAllowed,
          bool bailOutOnHelper,LabelInstr *labelBailOut)

{
  undefined2 valueType;
  Lowerer *this_00;
  code *pcVar1;
  LowererMDArch *pLVar2;
  OpndKind OVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  BailOutKind BVar7;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar8;
  RegOpnd *opndSrc;
  Instr *pIVar9;
  Opnd *this_01;
  Opnd *pOVar10;
  BranchInstr *instr;
  LabelInstr *labelHelper;
  LabelInstr *pLVar11;
  RegOpnd *pRVar12;
  undefined1 *puVar13;
  JITTimeFunctionBody *this_02;
  FunctionJITTimeInfo *this_03;
  undefined **ppuVar14;
  LabelInstr *local_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  LowererMDArch *pLStack_38;
  ValueType src1ValueType;
  
  pLStack_38 = this;
  OVar3 = IR::Opnd::GetKind(instrLoad->m_src1);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa74,"(instrLoad->GetSrc1()->IsRegOpnd())",
                       "instrLoad->GetSrc1()->IsRegOpnd()");
    if (!bVar4) goto LAB_00649265;
    *puVar8 = 0;
  }
  pRVar12 = (RegOpnd *)instrLoad->m_src1;
  if ((pRVar12->super_Opnd).m_type != TyVar) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa75,"(instrLoad->GetSrc1()->GetType() == TyVar)",
                       "instrLoad->GetSrc1()->GetType() == TyVar");
    if (!bVar4) goto LAB_00649265;
    *puVar8 = 0;
    pRVar12 = (RegOpnd *)instrLoad->m_src1;
  }
  pOVar10 = instrLoad->m_dst;
  OVar3 = IR::Opnd::GetKind(&pRVar12->super_Opnd);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_00649265;
    *puVar8 = 0;
  }
  bVar4 = IR::Opnd::IsTaggedInt(&pRVar12->super_Opnd);
  if (bVar4) {
    bVar6 = false;
  }
  else {
    bVar6 = IR::Opnd::IsNotInt(&pRVar12->super_Opnd);
  }
  bVar5 = IR::Opnd::IsEqual(&pRVar12->super_Opnd,instrLoad->m_dst);
  opndSrc = pRVar12;
  if (!bVar5) {
    opndSrc = IR::RegOpnd::New(TyVar,instrLoad->m_func);
    valueType = (pRVar12->super_Opnd).m_valueType;
    IR::Opnd::SetValueType(&opndSrc->super_Opnd,(ValueType)valueType);
    pIVar9 = IR::Instr::New(MOV,&opndSrc->super_Opnd,&pRVar12->super_Opnd,instrLoad->m_func);
    IR::Instr::InsertBefore(instrLoad,pIVar9);
  }
  local_3a = (opndSrc->super_Opnd).m_valueType.field_0;
  bVar5 = ValueType::IsLikelyFloat((ValueType *)&local_3a.field_0);
  if ((bVar5) || (bVar5 = ValueType::IsLikelyUntaggedInt((ValueType *)&local_3a.field_0), bVar5)) {
    bVar5 = true;
    if ((instrLoad->field_0x38 & 0x10) != 0) {
      BVar7 = IR::Instr::GetBailOutKind(instrLoad);
      if (BVar7 == BailOutIntOnly) goto LAB_00648f46;
      BVar7 = IR::Instr::GetBailOutKind(instrLoad);
      bVar5 = BVar7 != BailOutExpectingInteger;
    }
  }
  else {
LAB_00648f46:
    bVar5 = false;
  }
  if (bVar6 == false) {
    if (bVar4) {
      local_50 = (LabelInstr *)0x0;
      labelHelper = (LabelInstr *)0x0;
    }
    else {
      if (bVar5) {
        labelHelper = (LabelInstr *)0x0;
        local_50 = IR::LabelInstr::New(Label,instrLoad->m_func,false);
      }
      else {
        labelHelper = IR::LabelInstr::New(Label,instrLoad->m_func,true);
        local_50 = (LabelInstr *)0x0;
      }
      pLVar11 = local_50;
      if (local_50 == (LabelInstr *)0x0) {
        pLVar11 = labelHelper;
      }
      LowererMD::GenerateSmIntTest
                (pLStack_38->lowererMD,&opndSrc->super_Opnd,instrLoad,pLVar11,(Instr **)0x0,false);
    }
    this_01 = IR::Opnd::UseWithNewType(&opndSrc->super_Opnd,TyInt32,instrLoad->m_func);
    OVar3 = IR::Opnd::GetKind(this_01);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar6) goto LAB_00649265;
      *puVar8 = 0;
    }
    pOVar10 = IR::Opnd::UseWithNewType(pOVar10,TyInt32,instrLoad->m_func);
    pIVar9 = IR::Instr::New(MOV_TRUNC,pOVar10,this_01,instrLoad->m_func);
    IR::Instr::InsertBefore(instrLoad,pIVar9);
    if (bVar4) goto LAB_006491d4;
    pLVar11 = IR::Instr::GetOrCreateContinueLabel(instrLoad,false);
    instr = IR::BranchInstr::New(JMP,pLVar11,pLStack_38->m_func);
    IR::Instr::InsertBefore(instrLoad,&instr->super_Instr);
    if (bVar5) {
      if (local_50 != (LabelInstr *)0x0) {
        IR::Instr::InsertBefore(instrLoad,&local_50->super_Instr);
      }
      if (labelHelper == (LabelInstr *)0x0) goto LAB_006490eb;
      goto LAB_00649101;
    }
LAB_00649142:
    if (labelHelper != (LabelInstr *)0x0) {
      IR::Instr::InsertBefore(instrLoad,&labelHelper->super_Instr);
    }
  }
  else {
    if (bailOutOnHelper && !bVar5) {
      bVar4 = GlobOpt::DoEliminateArrayAccessHelperCall(pLStack_38->m_func);
      pLVar2 = pLStack_38;
      if (bVar4) {
        puVar13 = (undefined1 *)__cxa_allocate_exception(1);
        *puVar13 = 0x16;
        ppuVar14 = &Js::RejitException::typeinfo;
      }
      else {
        this_02 = JITTimeWorkItem::GetJITFunctionBody(pLStack_38->m_func->m_workItem);
        sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_02);
        this_03 = JITTimeWorkItem::GetJITTimeInfo(pLVar2->m_func->m_workItem);
        functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
        bVar4 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,BailOutPhase,sourceContextId,functionId);
        if (bVar4) {
          Output::Print(L"    Aborting JIT because EliminateArrayAccessHelperCall is already off\n")
          ;
          Output::Flush();
        }
        puVar13 = (undefined1 *)__cxa_allocate_exception(1);
        ppuVar14 = &Js::OperationAbortedException::typeinfo;
      }
      __cxa_throw(puVar13,ppuVar14,0);
    }
    if (bVar4) goto LAB_006491d4;
    if (bVar5) {
      pLVar11 = (LabelInstr *)0x0;
LAB_006490eb:
      labelHelper = IR::LabelInstr::New(Label,instrLoad->m_func,true);
LAB_00649101:
      if (pLVar11 == (LabelInstr *)0x0) {
        pLVar11 = IR::Instr::GetOrCreateContinueLabel(instrLoad,false);
      }
      pLVar2 = pLStack_38;
      pRVar12 = LowererMD::CheckFloatAndUntag(pLStack_38->lowererMD,opndSrc,instrLoad,labelHelper);
      LowererMD::ConvertFloatToInt32
                (pLVar2->lowererMD,instrLoad->m_dst,&pRVar12->super_Opnd,labelHelper,pLVar11,
                 instrLoad);
      goto LAB_00649142;
    }
  }
  if (((instrLoad->field_0x38 & 0x10) != 0) &&
     ((BVar7 = IR::Instr::GetBailOutKind(instrLoad), BVar7 == BailOutIntOnly ||
      (BVar7 = IR::Instr::GetBailOutKind(instrLoad), BVar7 == BailOutExpectingInteger)))) {
    Lowerer::LoadInt32FromUntaggedVar(pLStack_38->lowererMD->m_lowerer,instrLoad);
    return true;
  }
  if (!bailOutOnHelper) {
    this_00 = pLStack_38->lowererMD->m_lowerer;
    if (!conversionFromObjectAllowed) {
      Lowerer::LowerUnaryHelperMemWithBoolReference
                (this_00,instrLoad,HelperConv_ToInt32_NoObjects,true);
      return false;
    }
    Lowerer::LowerUnaryHelperMem(this_00,instrLoad,HelperConv_ToInt32,(Opnd *)0x0);
    return false;
  }
  if (labelBailOut == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xb09,"(labelBailOut)","labelBailOut");
    if (!bVar4) {
LAB_00649265:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar8 = 0;
  }
  Lowerer::InsertBranch(Br,labelBailOut,instrLoad);
LAB_006491d4:
  IR::Instr::Remove(instrLoad);
  return false;
}

Assistant:

bool
LowererMDArch::EmitLoadInt32(IR::Instr *instrLoad, bool conversionFromObjectAllowed, bool bailOutOnHelper, IR::LabelInstr * labelBailOut)
{
    //
    //    r1 = MOV src1
    // rtest = MOV src1
    //         SHR rtest, AtomTag_Shift
    //         CMP rtest, 1
    //         JNE $helper or $float
    // r_dst = MOV_TRUNC e_src1
    //         JMP $done
    //  $float:
    //     dst = ConvertToFloat(r1, $helper)
    // $helper:
    // r_dst = ToInt32()
    //

    Assert(instrLoad->GetSrc1()->IsRegOpnd());
    Assert(instrLoad->GetSrc1()->GetType() == TyVar);

    // TODO: Fix bad lowering. We shouldn't see TyVars here.
    // Assert(instrLoad->GetDst()->GetType() == TyInt32);

    bool isInt             = false;
    bool isNotInt          = false;
    IR::Opnd *dst          = instrLoad->GetDst();
    IR::RegOpnd *src1      = instrLoad->GetSrc1()->AsRegOpnd();
    IR::LabelInstr *helper = nullptr;
    IR::LabelInstr *labelFloat = nullptr;
    IR::LabelInstr *done   = nullptr;

    if (src1->IsTaggedInt())
    {
        isInt = true;
    }
    else if (src1->IsNotInt())
    {
        isNotInt = true;
    }

    if (src1->IsEqual(instrLoad->GetDst()) == false)
    {
        // r1 = MOV src1
        IR::RegOpnd *r1 = IR::RegOpnd::New(TyVar, instrLoad->m_func);
        r1->SetValueType(src1->GetValueType());
        instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV, r1, src1, instrLoad->m_func));
        src1 = r1;
    }

    const ValueType src1ValueType(src1->GetValueType());
    const bool doFloatToIntFastPath =
        (src1ValueType.IsLikelyFloat() || src1ValueType.IsLikelyUntaggedInt()) &&
                !(instrLoad->HasBailOutInfo() && (instrLoad->GetBailOutKind() == IR::BailOutIntOnly || instrLoad->GetBailOutKind() == IR::BailOutExpectingInteger));

    if (isNotInt)
    {
        // Known to be non-integer. If we are required to bail out on helper call, just re-jit.
        if (!doFloatToIntFastPath && bailOutOnHelper)
        {
            if(!GlobOpt::DoEliminateArrayAccessHelperCall(this->m_func))
            {
                // Array access helper call removal is already off for some reason. Prevent trying to rejit again
                // because it won't help and the same thing will happen again. Just abort jitting this function.
                if(PHASE_TRACE(Js::BailOutPhase, this->m_func))
                {
                    Output::Print(_u("    Aborting JIT because EliminateArrayAccessHelperCall is already off\n"));
                    Output::Flush();
                }
                throw Js::OperationAbortedException();
            }

            throw Js::RejitException(RejitReason::ArrayAccessHelperCallEliminationDisabled);
        }
    }
    else
    {
        // It could be an integer in this case.
        if (!isInt)
        {
            if(doFloatToIntFastPath)
            {
                labelFloat = IR::LabelInstr::New(Js::OpCode::Label, instrLoad->m_func, false);
            }
            else
            {
                helper = IR::LabelInstr::New(Js::OpCode::Label, instrLoad->m_func, true);
            }

            this->lowererMD->GenerateSmIntTest(src1, instrLoad, labelFloat ? labelFloat : helper);
        }
        IR::RegOpnd *src132 = src1->UseWithNewType(TyInt32, instrLoad->m_func)->AsRegOpnd();
#if !INT32VAR
        // src1 = SAR src1, VarTag_Shift
        instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::SAR,
                                               src132,
                                               src132,
                                               IR::IntConstOpnd::New(Js::VarTag_Shift, TyInt8, instrLoad->m_func),
                                               instrLoad->m_func));

        // r_dst = MOV src1
        // This is only a MOV (and not a MOVSXD) because we do a signed shift right, but we'll copy
        // all 64 bits.


        instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV,
                                               dst->UseWithNewType(TyMachReg, instrLoad->m_func),
                                               src1,
                                               instrLoad->m_func));

#else

        instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV_TRUNC,
                                               dst->UseWithNewType(TyInt32, instrLoad->m_func),
                                               src132,
                                               instrLoad->m_func));
#endif
        if (!isInt)
        {
            // JMP $done
            done = instrLoad->GetOrCreateContinueLabel();
            instrLoad->InsertBefore(IR::BranchInstr::New(Js::OpCode::JMP, done, m_func));
        }
    }

    if (!isInt)
    {
        if(doFloatToIntFastPath)
        {
            if(labelFloat)
            {
                instrLoad->InsertBefore(labelFloat);
            }
            if(!helper)
            {
                helper = IR::LabelInstr::New(Js::OpCode::Label, instrLoad->m_func, true);
            }

            if(!done)
            {
                done = instrLoad->GetOrCreateContinueLabel();
            }
#if FLOATVAR
            IR::RegOpnd* floatOpnd = this->lowererMD->CheckFloatAndUntag(src1, instrLoad, helper);
#else
            this->lowererMD->GenerateFloatTest(src1, instrLoad, helper, instrLoad->HasBailOutInfo());
            IR::IndirOpnd* floatOpnd = IR::IndirOpnd::New(src1, Js::JavascriptNumber::GetValueOffset(), TyMachDouble, this->m_func);
#endif
            this->lowererMD->ConvertFloatToInt32(instrLoad->GetDst(), floatOpnd, helper, done, instrLoad);
        }

        // $helper:
        if (helper)
        {
            instrLoad->InsertBefore(helper);
        }
        if(instrLoad->HasBailOutInfo() && (instrLoad->GetBailOutKind() == IR::BailOutIntOnly || instrLoad->GetBailOutKind() == IR::BailOutExpectingInteger))
        {
            // Avoid bailout if we have a JavascriptNumber whose value is a signed 32-bit integer
            lowererMD->m_lowerer->LoadInt32FromUntaggedVar(instrLoad);

            // Need to bail out instead of calling a helper
            return true;
        }

        if (bailOutOnHelper)
        {
            Assert(labelBailOut);
            lowererMD->m_lowerer->InsertBranch(Js::OpCode::Br, labelBailOut, instrLoad);
            instrLoad->Remove();
        }
        else if (conversionFromObjectAllowed)
        {
            lowererMD->m_lowerer->LowerUnaryHelperMem(instrLoad, IR::HelperConv_ToInt32);
        }
        else
        {
            lowererMD->m_lowerer->LowerUnaryHelperMemWithBoolReference(instrLoad, IR::HelperConv_ToInt32_NoObjects, true /*useBoolForBailout*/);
        }
    }
    else
    {
        instrLoad->Remove();
    }

    return false;
}